

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int __thiscall ncnn::UnaryOp::forward_inplace(UnaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  Option *in_RSI;
  Mat *in_RDI;
  int local_4;
  
  if ((int)in_RDI[2].cstep == 0) {
    local_4 = unary_op_inplace<ncnn::unary_op_abs<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 1) {
    local_4 = unary_op_inplace<ncnn::unary_op_neg<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 2) {
    local_4 = unary_op_inplace<ncnn::unary_op_floor<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 3) {
    local_4 = unary_op_inplace<ncnn::unary_op_ceil<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 4) {
    local_4 = unary_op_inplace<ncnn::unary_op_square<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 5) {
    local_4 = unary_op_inplace<ncnn::unary_op_sqrt<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 6) {
    local_4 = unary_op_inplace<ncnn::unary_op_rsqrt<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 7) {
    local_4 = unary_op_inplace<ncnn::unary_op_exp<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 8) {
    local_4 = unary_op_inplace<ncnn::unary_op_log<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 9) {
    local_4 = unary_op_inplace<ncnn::unary_op_sin<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 10) {
    local_4 = unary_op_inplace<ncnn::unary_op_cos<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xb) {
    local_4 = unary_op_inplace<ncnn::unary_op_tan<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xc) {
    local_4 = unary_op_inplace<ncnn::unary_op_asin<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xd) {
    local_4 = unary_op_inplace<ncnn::unary_op_acos<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xe) {
    local_4 = unary_op_inplace<ncnn::unary_op_atan<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0xf) {
    local_4 = unary_op_inplace<ncnn::unary_op_reciprocal<float>>(in_RDI,in_RSI);
  }
  else if ((int)in_RDI[2].cstep == 0x10) {
    local_4 = unary_op_inplace<ncnn::unary_op_tanh<float>>(in_RDI,in_RSI);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int UnaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ABS)
        return unary_op_inplace< unary_op_abs<float> >(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace< unary_op_neg<float> >(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace< unary_op_floor<float> >(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace< unary_op_ceil<float> >(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace< unary_op_square<float> >(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace< unary_op_sqrt<float> >(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace< unary_op_rsqrt<float> >(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace< unary_op_exp<float> >(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace< unary_op_log<float> >(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace< unary_op_sin<float> >(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace< unary_op_cos<float> >(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace< unary_op_tan<float> >(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace< unary_op_asin<float> >(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace< unary_op_acos<float> >(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace< unary_op_atan<float> >(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace< unary_op_reciprocal<float> >(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace< unary_op_tanh<float> >(bottom_top_blob, opt);

    return 0;
}